

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O3

void Nwk_ObjAddFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  long lVar1;
  int iVar2;
  
  if (pObj->pMan != pFanin->pMan) {
    __assert_fail("pObj->pMan == pFanin->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xa8,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if ((-1 < pObj->Id) && (-1 < pFanin->Id)) {
    if (pObj->nFanouts + pObj->nFanins == pObj->nFanioAlloc) {
      Nwk_ManReallocNode(pObj);
    }
    if (pFanin->nFanouts + pFanin->nFanins == pFanin->nFanioAlloc) {
      Nwk_ManReallocNode(pFanin);
    }
    iVar2 = pObj->nFanins;
    if (0 < pObj->nFanouts) {
      lVar1 = (long)(pObj->nFanouts + iVar2);
      do {
        pObj->pFanio[lVar1] = pObj->pFanio[lVar1 + -1];
        lVar1 = lVar1 + -1;
      } while (iVar2 < lVar1);
    }
    pObj->nFanins = iVar2 + 1;
    pObj->pFanio[iVar2] = pFanin;
    iVar2 = pFanin->nFanouts;
    pFanin->nFanouts = iVar2 + 1;
    pFanin->pFanio[(long)pFanin->nFanins + (long)iVar2] = pObj;
    iVar2 = (uint)((*(uint *)&pObj->field_0x20 & 7) == 3) + pFanin->Level;
    if (iVar2 < pObj->Level) {
      iVar2 = pObj->Level;
    }
    pObj->Level = iVar2;
    return;
  }
  __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0xa9,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjAddFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i;
    assert( pObj->pMan == pFanin->pMan );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( Nwk_ObjReallocIsNeeded(pObj) )
        Nwk_ManReallocNode( pObj );
    if ( Nwk_ObjReallocIsNeeded(pFanin) )
        Nwk_ManReallocNode( pFanin );
    for ( i = pObj->nFanins + pObj->nFanouts; i > pObj->nFanins; i-- )
        pObj->pFanio[i] = pObj->pFanio[i-1];
    pObj->pFanio[pObj->nFanins++] = pFanin;
    pFanin->pFanio[pFanin->nFanins + pFanin->nFanouts++] = pObj;
    pObj->Level = Abc_MaxInt( pObj->Level, pFanin->Level + Nwk_ObjIsNode(pObj) );
}